

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segmentation.c
# Opt level: O1

void av1_reset_segment_features(AV1_COMMON *cm)

{
  (cm->seg).enabled = '\0';
  (cm->seg).update_map = '\0';
  (cm->seg).update_data = '\0';
  av1_clearall_segfeatures(&cm->seg);
  return;
}

Assistant:

void av1_reset_segment_features(AV1_COMMON *cm) {
  struct segmentation *seg = &cm->seg;

  // Set up default state for MB feature flags
  seg->enabled = 0;
  seg->update_map = 0;
  seg->update_data = 0;
  av1_clearall_segfeatures(seg);
}